

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

ON_wString __thiscall ON_XMLNode::GetPathFromRoot(ON_XMLNode *this)

{
  long lVar1;
  int iVar2;
  ON_wString *src;
  ON_XMLNode *pNode;
  long *in_RSI;
  
  lVar1 = in_RSI[1];
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(lVar1 + 0x40));
  if (iVar2 == 0) {
    src = (ON_wString *)(**(code **)(*in_RSI + 0x18))();
    ON_wString::ON_wString((ON_wString *)this,src);
    pNode = (ON_XMLNode *)(**(code **)(*in_RSI + 0x40))();
    PrependNodeToStringAndRecurseParents(pNode,(ON_wString *)this);
    pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 0x40));
    return (ON_wString)(wchar_t *)this;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

ON_wString ON_XMLNode::GetPathFromRoot(void) const
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  ON_wString sPath = TagName();
  PrependNodeToStringAndRecurseParents(Parent(), sPath);

  return sPath;
}